

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

int mpc_nparse(char *filename,char *string,size_t length,mpc_parser_t *p,mpc_result_t *r)

{
  int iVar1;
  mpc_input_t *i;
  size_t sVar2;
  char *pcVar3;
  mpc_state_t *pmVar4;
  
  i = (mpc_input_t *)malloc(0x8278);
  sVar2 = strlen(filename);
  pcVar3 = (char *)malloc(sVar2 + 1);
  i->filename = pcVar3;
  strcpy(pcVar3,filename);
  i->type = 0;
  (i->state).pos = 0;
  (i->state).row = 0;
  *(undefined8 *)((long)&(i->state).row + 4) = 0;
  *(undefined8 *)((long)&(i->state).col + 4) = 0;
  pcVar3 = (char *)malloc(length + 1);
  i->string = pcVar3;
  strncpy(pcVar3,string,length);
  pcVar3[length] = '\0';
  i->buffer = (char *)0x0;
  i->file = (FILE *)0x0;
  i->suppress = 0;
  i->backtrack = 1;
  i->marks_slots = 0x20;
  i->marks_num = 0;
  pmVar4 = (mpc_state_t *)malloc(0x400);
  i->marks = pmVar4;
  pcVar3 = (char *)malloc(0x20);
  i->lasts = pcVar3;
  i->last = '\0';
  memset(&i->mem_index,0,0x208);
  iVar1 = mpc_parse_input(i,p,r);
  mpc_input_delete(i);
  return iVar1;
}

Assistant:

int mpc_nparse(const char *filename, const char *string, size_t length, mpc_parser_t *p, mpc_result_t *r) {
  int x;
  mpc_input_t *i = mpc_input_new_nstring(filename, string, length);
  x = mpc_parse_input(i, p, r);
  mpc_input_delete(i);
  return x;
}